

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

shared_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::delay_load_torrent
          (session_impl *this,info_hash_t *info_hash,peer_connection *pc)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  add_torrent_params *this_00;
  undefined8 *puVar3;
  long *plVar4;
  char cVar5;
  int iVar6;
  long in_RCX;
  peer_connection *extraout_RDX;
  peer_connection *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 *puVar8;
  shared_ptr<libtorrent::aux::torrent> sVar9;
  error_code ec;
  torrent_handle handle;
  add_torrent_params p;
  undefined4 local_3b8;
  uint uStack_3b4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  undefined1 local_3a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  add_torrent_params *local_398;
  undefined1 local_390 [16];
  add_torrent_params local_380;
  
  puVar8 = *(undefined8 **)(info_hash[0xa0].v2.m_number._M_elems + 7);
  puVar3 = *(undefined8 **)(info_hash[0xa1].v1.m_number._M_elems + 1);
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pc;
  if (puVar8 != puVar3) {
    this_00 = (add_torrent_params *)(local_390 + 0x10);
    local_398 = (add_torrent_params *)info_hash;
    do {
      add_torrent_params::add_torrent_params(this_00);
      plVar4 = (long *)*puVar8;
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_3b8,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 (in_RCX + 0x88));
      if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_3b0->_M_weak_count = local_3b0->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_3b0->_M_weak_count = local_3b0->_M_weak_count + 1;
        }
      }
      local_3a0 = local_3b0;
      cVar5 = (**(code **)(*plVar4 + 0x40))(plVar4,pc,local_3a8,this_00);
      if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_3a0->_M_weak_count;
          iVar6 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = local_3a0->_M_weak_count;
          local_3a0->_M_weak_count = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (*local_3a0->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
      }
      if (cVar5 != '\0') {
        local_3b8 = 0;
        uStack_3b4 = uStack_3b4 & 0xffffff00;
        local_3b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
        add_torrent((session_impl *)local_390,local_398,(error_code *)(local_390 + 0x10));
        torrent_handle::native_handle((torrent_handle *)this);
        if ((_func_int **)local_390._8_8_ != (_func_int **)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)(local_390._8_8_ + 0xc);
            iVar6 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar6 = *(int *)(local_390._8_8_ + 0xc);
            *(int *)(local_390._8_8_ + 0xc) = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (**(code **)(*(_func_int **)local_390._8_8_ + 0x18))();
          }
        }
        add_torrent_params::~add_torrent_params((add_torrent_params *)(local_390 + 0x10));
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
        goto LAB_002c75bd;
      }
      add_torrent_params::~add_torrent_params(this_00);
      puVar8 = puVar8 + 2;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    } while (puVar8 != puVar3);
  }
  (this->super_session_interface).super_session_logger._vptr_session_logger = (_func_int **)0x0;
  (this->super_dht_observer).super_dht_logger._vptr_dht_logger = (_func_int **)0x0;
LAB_002c75bd:
  sVar9.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar9.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::aux::torrent>)
         sVar9.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent> session_impl::delay_load_torrent(info_hash_t const& info_hash
		, peer_connection* pc)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			add_torrent_params p;
			if (e->on_unknown_torrent(info_hash, peer_connection_handle(pc->self()), p))
			{
				error_code ec;
				torrent_handle handle = add_torrent(std::move(p), ec);

				return handle.native_handle();
			}
		}
#else
		TORRENT_UNUSED(pc);
		TORRENT_UNUSED(info_hash);
#endif
		return std::shared_ptr<torrent>();
	}